

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O3

void __thiscall mau::ProxySession::postNextTimer(ProxySession *this)

{
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *pbVar1;
  long lVar2;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:573:25)>
  *op;
  error_category *peVar3;
  thread_info_base *this_thread;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_50;
  ptr local_48;
  
  local_48.h = (anon_class_8_1_8991fb9c *)0x3b9aca00;
  asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::expires_after((this->Ticker)._M_t.
                  super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
                  .
                  super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
                  ._M_head_impl,(duration *)&local_48);
  pbVar1 = (this->Ticker)._M_t.
           super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
           .
           super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_*,_false>
           ._M_head_impl;
  local_48.h = &local_50;
  lVar2 = (long)(pbVar1->
                super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                ).service_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_50.this = this;
  op = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:573:25)>
        *)asio::detail::thread_info_base::allocate(this_thread,0x30);
  (op->super_wait_op).super_operation.next_ = (scheduler_operation *)0x0;
  (op->super_wait_op).super_operation.func_ =
       asio::detail::
       wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:573:25)>
       ::do_complete;
  (op->super_wait_op).super_operation.task_result_ = 0;
  (op->super_wait_op).ec_._M_value = 0;
  local_48.v = op;
  peVar3 = (error_category *)std::_V2::system_category();
  (op->super_wait_op).ec_._M_cat = peVar3;
  (op->handler_).this = local_50.this;
  *(bool *)((long)&(pbVar1->
                   super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                   ).implementation_ + 8) = true;
  local_48.p = op;
  asio::detail::epoll_reactor::
  schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
            (*(epoll_reactor **)(lVar2 + 0x58),
             (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              *)(lVar2 + 0x28),
             &(pbVar1->
              super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
              ).implementation_.expiry,
             (per_timer_data *)
             ((long)&(pbVar1->
                     super_basic_io_object<asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_true>
                     ).implementation_ + 0x10),(wait_op *)op);
  local_48.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:573:25)>
                *)0x0;
  local_48.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:573:25)>
                *)0x0;
  asio::detail::
  wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:573:25)>
  ::ptr::reset(&local_48);
  return;
}

Assistant:

void ProxySession::postNextTimer()
{
    static const unsigned kTickIntervalUsec = 1000 * 1000; /// 1 second
    Ticker->expires_after(std::chrono::microseconds(kTickIntervalUsec));

    Ticker->async_wait(([this](const asio::error_code& error)
    {
        if (!error)
        {
            onTick();
            postNextTimer();
        }
    }));
}